

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::vec_add_trunc_multipredict<sparse_parameters>
               (multipredict_info<sparse_parameters> *mp,float fx,uint64_t fi)

{
  float fVar1;
  weight *pwVar2;
  size_t c;
  ulong uVar3;
  long lVar4;
  float fVar5;
  
  lVar4 = 0;
  for (uVar3 = 0; uVar3 < mp->count; uVar3 = uVar3 + 1) {
    pwVar2 = sparse_parameters::operator[](mp->weights,fi);
    fVar1 = *pwVar2;
    fVar5 = 0.0;
    if (mp->gravity < ABS(fVar1)) {
      fVar5 = mp->gravity * *(float *)(&DAT_0023a678 + (ulong)(fVar1 < 0.0) * 4) + fVar1;
    }
    *(float *)((long)mp->pred + lVar4) = fVar5 * fx + *(float *)((long)mp->pred + lVar4);
    fi = fi + mp->step;
    lVar4 = lVar4 + 0x20;
  }
  return;
}

Assistant:

inline void vec_add_trunc_multipredict(multipredict_info<T>& mp, const float fx, uint64_t fi)
{
  size_t index = fi;
  for (size_t c = 0; c < mp.count; c++, index += mp.step)
    mp.pred[c].scalar += fx * trunc_weight(mp.weights[index], mp.gravity);
}